

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

void __thiscall
chrono::curiosity::CuriosityRocker::CuriosityRocker
          (CuriosityRocker *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,int side)

{
  char *pcVar1;
  shared_ptr<chrono::ChMaterialSurface> local_28;
  
  local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,rel_pos,&local_28,false);
  if (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_0017e9e8;
  pcVar1 = "curiosity_F_R_arm";
  if (side == 0) {
    pcVar1 = "curiosity_F_L_arm";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CuriosityPart).m_mesh_name,0,
             (char *)(this->super_CuriosityPart).m_mesh_name._M_string_length,(ulong)pcVar1);
  (this->super_CuriosityPart).m_color.R = 1.0;
  (this->super_CuriosityPart).m_color.G = 0.4;
  (this->super_CuriosityPart).m_color.B = 0.0;
  CuriosityPart::CalcMassProperties(&this->super_CuriosityPart,2000.0);
  return;
}

Assistant:

CuriosityRocker::CuriosityRocker(const std::string& name,
                                 const ChFrame<>& rel_pos,
                                 std::shared_ptr<ChMaterialSurface> mat,
                                 int side)
    : CuriosityPart(name, rel_pos, mat, false) {
    m_mesh_name = (side == 0) ? "curiosity_F_L_arm" : "curiosity_F_R_arm";
    m_color = ChColor(1.0f, 0.4f, 0.0f);

    // Titanium tubing (use an average density)
    CalcMassProperties(2000);
}